

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

TValue * index2addr(lua_State *L,int idx)

{
  ushort uVar1;
  CallInfo *pCVar2;
  lua_CFunction p_Var3;
  TValue *pTVar4;
  char *__assertion;
  
  pCVar2 = L->ci;
  if (idx < 1) {
    if (-0xf4628 < idx) {
      if ((idx != 0) &&
         ((long)(ulong)(uint)-idx <= (long)L->top + (-0x10 - (long)pCVar2->func) >> 4)) {
        return L->top + idx;
      }
      __assert_fail("(idx != 0 && -idx <= L->top - (ci->func + 1)) && \"invalid index\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x4a,"TValue *index2addr(lua_State *, int)");
    }
    if (idx == -0xf4628) {
      return &L->l_G->l_registry;
    }
    if (idx < -0xf46a6) {
      __assert_fail("(idx <= 125 + 1) && \"upvalue index too large\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x51,"TValue *index2addr(lua_State *, int)");
    }
    uVar1 = pCVar2->func->tt_;
    if ((uVar1 & 0x7f) != 0x46 && uVar1 != 0x16) {
      if (uVar1 == 0x8026) {
        p_Var3 = (pCVar2->func->value_).f;
        if (p_Var3[8] == (_func_int_lua_State_ptr)0x26) {
          if (-0xf4628 - idx <= (int)(uint)(byte)p_Var3[10]) {
            return (TValue *)(p_Var3 + (ulong)(-idx - 0xf4629) * 0x10 + 0x20);
          }
          goto LAB_0010c3e6;
        }
        __assertion = "(((ci->func)->value_).gc)->tt == ((6) | ((2) << 4))";
      }
      else {
        __assertion = "((((ci->func))->tt_) == (((((6) | ((2) << 4))) | (1 << 15))))";
      }
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x55,"TValue *index2addr(lua_State *, int)");
    }
  }
  else {
    if ((long)pCVar2->top + (-0x10 - (long)pCVar2->func) >> 4 < (long)(ulong)(uint)idx) {
      __assert_fail("(idx <= ci->top - (ci->func + 1)) && \"unacceptable index\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x45,"TValue *index2addr(lua_State *, int)");
    }
    pTVar4 = pCVar2->func + (uint)idx;
    if (pTVar4 < L->top) {
      return pTVar4;
    }
  }
LAB_0010c3e6:
  return &luaO_nilobject_;
}

Assistant:

static TValue *index2addr (lua_State *L, int idx) {
  CallInfo *ci = L->ci;
  if (idx > 0) {
    TValue *o = ci->func + idx;
    api_check(L, idx <= ci->top - (ci->func + 1), "unacceptable index");
    if (o >= L->top) return NONVALIDVALUE;
    else return o;
  }
  else if (!ispseudo(idx)) {  /* negative index */
    api_check(L, idx != 0 && -idx <= L->top - (ci->func + 1), "invalid index");
    return L->top + idx;
  }
  else if (idx == LUA_REGISTRYINDEX)
    return &G(L)->l_registry;
  else {  /* upvalues */
    idx = LUA_REGISTRYINDEX - idx;
    api_check(L, idx <= MAXUPVAL + 1, "upvalue index too large");
    if (ttislcf(ci->func) || ttisfcf(ci->func))  /* light C function? */
      return NONVALIDVALUE;  /* it has no upvalues */
    else {
      CClosure *func = clCvalue(ci->func);
      return (idx <= func->nupvalues) ? &func->upvalue[idx-1] : NONVALIDVALUE;
    }
  }
}